

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O2

void __thiscall indk::Interlink::doInitOutput(Interlink *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  Client *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = System::getVerbosityLevel();
  if (0 < iVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Incoming Interlink connection from ");
    std::operator+(&local_38,&this->Host,":");
    std::operator+(&bStack_58,&local_38,&this->OutputPort);
    poVar3 = std::operator<<(poVar3,(string *)&bStack_58);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this_00 = (Client *)operator_new(8);
  std::operator+(&local_38,&this->Host,":");
  std::operator+(&bStack_58,&local_38,&this->OutputPort);
  httplib::Client::Client(this_00,&bStack_58);
  this->Output = this_00;
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  lVar1 = *this->Output;
  *(undefined8 *)(lVar1 + 0x170) = 5;
  *(undefined8 *)(lVar1 + 0x178) = 0;
  *(undefined8 *)(lVar1 + 0x180) = 5;
  *(undefined8 *)(lVar1 + 0x188) = 0;
  *(undefined8 *)(lVar1 + 0x160) = 0;
  *(undefined8 *)(lVar1 + 0x168) = 500000;
  LOCK();
  (this->Interlinked)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

void indk::Interlink::doInitOutput() {
    if (indk::System::getVerbosityLevel() > 0)
        std::cout << "Incoming Interlink connection from " << Host+":"+OutputPort << std::endl;
    Output = new httplib::Client(Host+":"+OutputPort);
    auto output = (httplib::Client*)Output;
    output -> set_read_timeout(5, 0);
    output -> set_write_timeout(5, 0);
    output -> set_connection_timeout(0, 500000);
    Interlinked.store(true);
}